

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  CURLcode retcode;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  Curl_reset_reqproto(conn);
  conn_local._4_4_ = pop3_init(conn);
  if (((conn_local._4_4_ == CURLE_OK) &&
      (conn_local._4_4_ = pop3_parse_url_path(conn), conn_local._4_4_ == CURLE_OK)) &&
     (conn_local._4_4_ = pop3_parse_custom_request(conn), conn_local._4_4_ == CURLE_OK)) {
    conn_local._4_4_ = pop3_regular_transfer(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode retcode = CURLE_OK;

  *done = FALSE; /* default to false */

  /*
    Since connections can be re-used between SessionHandles, this might be a
    connection already existing but on a fresh SessionHandle struct so we must
    make sure we have a good 'struct POP3' to play with. For new connections,
    the struct POP3 is allocated and setup in the pop3_connect() function.
  */
  Curl_reset_reqproto(conn);
  retcode = pop3_init(conn);
  if(retcode)
    return retcode;

  /* Parse the URL path */
  retcode = pop3_parse_url_path(conn);
  if(retcode)
    return retcode;

  /* Parse the custom request */
  retcode = pop3_parse_custom_request(conn);
  if(retcode)
    return retcode;

  retcode = pop3_regular_transfer(conn, done);

  return retcode;
}